

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void mask_write_buffer(cio_write_buffer *write_buffer,uint8_t *mask,size_t mask_length)

{
  uint8_t uVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  size_t i;
  size_t sVar9;
  
  sVar2 = (write_buffer->data).head.q_len;
  for (sVar9 = 0; sVar9 != sVar2; sVar9 = sVar9 + 1) {
    write_buffer = write_buffer->next;
    cio_websocket_mask((uint8_t *)(write_buffer->data).element.field_0.const_data,
                       (write_buffer->data).element.length,mask);
    bVar3 = *(byte *)((long)&write_buffer->data + 8) & 3;
    bVar4 = bVar3;
    for (bVar6 = 1; bVar8 = bVar6 - 1, bVar8 != bVar3; bVar6 = bVar6 + 1) {
      uVar1 = mask[bVar8];
      bVar7 = bVar3 + 1;
      bVar5 = bVar4;
      if (bVar6 == bVar4) {
        bVar5 = bVar7;
      }
      mask[bVar8] = mask[bVar3];
      if (3 < bVar7) {
        bVar5 = bVar4;
      }
      mask[bVar3] = uVar1;
      bVar3 = bVar7;
      if (3 < bVar7) {
        bVar3 = bVar4;
      }
      bVar4 = bVar5;
    }
  }
  return;
}

Assistant:

static void mask_write_buffer(const struct cio_write_buffer *write_buffer, uint8_t *mask, size_t mask_length)
{
	size_t num_buffers = cio_write_buffer_get_num_buffer_elements(write_buffer);
	for (size_t i = 0; i < num_buffers; i++) {
		write_buffer = write_buffer->next;
		cio_websocket_mask(write_buffer->data.element.data, write_buffer->data.element.length, mask);
		size_t middle = write_buffer->data.element.length % mask_length;
		rotate(mask, (uint_fast8_t)middle);
	}
}